

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thermo.cpp
# Opt level: O2

RealType __thiscall OpenMD::Thermo::getRotationalKinetic(Thermo *this)

{
  double dVar1;
  double dVar2;
  Snapshot *this_00;
  undefined1 auVar3 [16];
  Molecule *pMVar4;
  ulong uVar5;
  ulong uVar6;
  pointer ppSVar7;
  StuntDouble *this_01;
  RealType RVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  double local_100;
  Vector3d angMom;
  MoleculeIterator miter;
  Mat3x3d I;
  RectMatrix<double,_3U,_3U> local_78;
  
  this_00 = this->info_->sman_->currentSnapshot_;
  if (this_00->hasRotationalKineticEnergy == false) {
    miter._M_node = (_Base_ptr)0x0;
    Vector<double,_3U>::Vector(&angMom.super_Vector<double,_3U>);
    SquareMatrix<double,_3>::SquareMatrix((SquareMatrix<double,_3> *)&I);
    pMVar4 = SimInfo::beginMolecule(this->info_,&miter);
    local_100 = 0.0;
    while (pMVar4 != (Molecule *)0x0) {
      ppSVar7 = (pMVar4->integrableObjects_).
                super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if (ppSVar7 !=
          (pMVar4->integrableObjects_).
          super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
          super__Vector_impl_data._M_finish) goto LAB_00159ce9;
      this_01 = (StuntDouble *)0x0;
      while (this_01 != (StuntDouble *)0x0) {
        if (this_01->objType_ - otDAtom < 2) {
          StuntDouble::getJ((Vector3d *)&local_78,this_01);
          Vector<double,_3U>::operator=
                    (&angMom.super_Vector<double,_3U>,(Vector<double,_3U> *)&local_78);
          (*this_01->_vptr_StuntDouble[5])(&local_78,this_01);
          RectMatrix<double,_3U,_3U>::operator=((RectMatrix<double,_3U,_3U> *)&I,&local_78);
          if (this_01->linear_ == true) {
            uVar6 = (long)(this_01->linearAxis_ + 1) % 3 & 0xffffffff;
            uVar5 = (long)(this_01->linearAxis_ + 2) % 3 & 0xffffffff;
            dVar1 = angMom.super_Vector<double,_3U>.data_[uVar6];
            dVar2 = angMom.super_Vector<double,_3U>.data_[uVar5];
            auVar9._0_8_ = dVar1 * dVar1;
            auVar9._8_8_ = dVar2 * dVar2;
            auVar3._8_8_ = *(undefined8 *)
                            ((long)I.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                                   data_ + uVar5 * 0x20);
            auVar3._0_8_ = *(undefined8 *)
                            ((long)I.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                                   data_ + uVar6 * 0x20);
            auVar10 = divpd(auVar9,auVar3);
            local_100 = local_100 + auVar10._8_8_ + auVar10._0_8_;
          }
          else {
            auVar11._0_8_ =
                 angMom.super_Vector<double,_3U>.data_[0] * angMom.super_Vector<double,_3U>.data_[0]
            ;
            auVar11._8_8_ =
                 angMom.super_Vector<double,_3U>.data_[2] * angMom.super_Vector<double,_3U>.data_[2]
            ;
            auVar10._8_8_ =
                 I.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][2];
            auVar10._0_8_ =
                 I.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0];
            auVar10 = divpd(auVar11,auVar10);
            local_100 = local_100 +
                        auVar10._8_8_ +
                        (angMom.super_Vector<double,_3U>.data_[1] *
                        angMom.super_Vector<double,_3U>.data_[1]) /
                        I.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][1]
                        + auVar10._0_8_;
          }
        }
        ppSVar7 = ppSVar7 + 1;
        this_01 = (StuntDouble *)0x0;
        if (ppSVar7 !=
            (pMVar4->integrableObjects_).
            super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
LAB_00159ce9:
          this_01 = *ppSVar7;
        }
      }
      pMVar4 = SimInfo::nextMolecule(this->info_,&miter);
    }
    Snapshot::setRotationalKineticEnergy(this_00,(local_100 * 0.5) / 0.0004184);
  }
  RVar8 = Snapshot::getRotationalKineticEnergy(this_00);
  return RVar8;
}

Assistant:

RealType Thermo::getRotationalKinetic() {
    Snapshot* snap = info_->getSnapshotManager()->getCurrentSnapshot();

    if (!snap->hasRotationalKineticEnergy) {
      SimInfo::MoleculeIterator miter;
      vector<StuntDouble*>::iterator iiter;
      Molecule* mol;
      StuntDouble* sd;
      Vector3d angMom;
      Mat3x3d I;
      int i, j, k;
      RealType kinetic(0.0);

      for (mol = info_->beginMolecule(miter); mol != NULL;
           mol = info_->nextMolecule(miter)) {
        for (sd = mol->beginIntegrableObject(iiter); sd != NULL;
             sd = mol->nextIntegrableObject(iiter)) {
          if (sd->isDirectional()) {
            angMom = sd->getJ();
            I      = sd->getI();

            if (sd->isLinear()) {
              i = sd->linearAxis();
              j = (i + 1) % 3;
              k = (i + 2) % 3;
              kinetic += angMom[j] * angMom[j] / I(j, j) +
                         angMom[k] * angMom[k] / I(k, k);
            } else {
              kinetic += angMom[0] * angMom[0] / I(0, 0) +
                         angMom[1] * angMom[1] / I(1, 1) +
                         angMom[2] * angMom[2] / I(2, 2);
            }
          }
        }
      }

#ifdef IS_MPI
      MPI_Allreduce(MPI_IN_PLACE, &kinetic, 1, MPI_REALTYPE, MPI_SUM,
                    MPI_COMM_WORLD);
#endif

      kinetic = kinetic * 0.5 / Constants::energyConvert;

      snap->setRotationalKineticEnergy(kinetic);
    }
    return snap->getRotationalKineticEnergy();
  }